

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ByteSize(Message *message)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar3;
  UnknownFieldSet *pUVar4;
  Reflection *this;
  long lVar5;
  int i_1;
  ulong uVar6;
  int i;
  long lVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  FieldDescriptor *local_38;
  long lVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x4b) == '\x01') {
    lVar5 = 0;
    for (lVar7 = 0; lVar7 < *(int *)(lVar2 + 0x68); lVar7 = lVar7 + 1) {
      local_38 = (FieldDescriptor *)(*(long *)(lVar2 + 0x28) + lVar5);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&local_58,&local_38);
      lVar5 = lVar5 + 0x98;
    }
  }
  else {
    Reflection::ListFields
              (this,message,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&local_58);
  }
  lVar5 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar6 = uVar6 + 1) {
    sVar3 = FieldByteSize(local_58._M_impl.super__Vector_impl_data._M_start[uVar6],message);
    lVar5 = lVar5 + sVar3;
  }
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x48) == '\x01') {
    pUVar4 = Reflection::GetUnknownFields(this,message);
    sVar3 = ComputeUnknownMessageSetItemsSize(pUVar4);
  }
  else {
    pUVar4 = Reflection::GetUnknownFields(this,message);
    sVar3 = ComputeUnknownFieldsSize(pUVar4);
  }
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&local_58);
  return sVar3 + lVar5;
}

Assistant:

size_t WireFormat::ByteSize(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = 0;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    our_size += FieldByteSize(fields[i], message);
  }

  if (descriptor->options().message_set_wire_format()) {
    our_size += ComputeUnknownMessageSetItemsSize(
        message_reflection->GetUnknownFields(message));
  } else {
    our_size +=
        ComputeUnknownFieldsSize(message_reflection->GetUnknownFields(message));
  }

  return our_size;
}